

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result_tests.cpp
# Opt level: O3

void __thiscall result_tests::check_returned::test_method(check_returned *this)

{
  pointer pcVar1;
  bilingual_str s;
  bilingual_str s_00;
  long in_FS_OFFSET;
  undefined8 in_stack_fffffffffffffdb8;
  undefined8 in_stack_fffffffffffffdc0;
  undefined1 *puVar2;
  long in_stack_fffffffffffffdc8;
  long in_stack_fffffffffffffdd0;
  undefined8 in_stack_fffffffffffffdd8;
  undefined8 in_stack_fffffffffffffde0;
  undefined1 *puVar3;
  long in_stack_fffffffffffffde8;
  long in_stack_fffffffffffffdf0;
  long *local_200 [2];
  long local_1f0 [2];
  long *local_1e0 [2];
  long local_1d0 [2];
  long *local_1c0;
  long local_1b8;
  long local_1b0 [2];
  undefined1 local_1a0 [32];
  _Alloc_hider local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170;
  long *local_160;
  long local_158;
  long local_150 [2];
  long *local_140 [2];
  long local_130 [2];
  long *local_120 [2];
  long local_110 [2];
  long *local_100;
  long local_f8;
  long local_f0 [2];
  long *local_e0;
  long local_d8;
  long local_d0 [2];
  undefined1 local_c0 [32];
  _Alloc_hider local_a0;
  size_type local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  _Variadic_union<bilingual_str,_bilingual_str> local_80;
  undefined1 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_80._0_4_ = 5;
  local_40 = 1;
  pcVar1 = local_c0 + 0x10;
  local_c0._8_8_ = 0;
  local_c0[0x10] = '\0';
  local_98 = 0;
  local_90._M_local_buf[0] = '\0';
  local_1a0._0_4_ = 5;
  local_c0._0_8_ = pcVar1;
  local_a0._M_p = (pointer)&local_90;
  ExpectSuccess<int,int>
            ((Result<int> *)&local_80._M_first,(bilingual_str *)local_c0,(int *)local_1a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_p != &local_90) {
    operator_delete(local_a0._M_p,
                    CONCAT71(local_90._M_allocated_capacity._1_7_,local_90._M_local_buf[0]) + 1);
  }
  if ((pointer)local_c0._0_8_ != pcVar1) {
    operator_delete((void *)local_c0._0_8_,CONCAT71(local_c0._17_7_,local_c0[0x10]) + 1);
  }
  std::__detail::__variant::_Variant_storage<false,_bilingual_str,_int>::~_Variant_storage
            ((_Variant_storage<false,_bilingual_str,_int> *)&local_80._M_first);
  IntFn((Result<int> *)&local_80._M_first,5,false);
  local_e0 = local_d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"int 5 error.","");
  local_c0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char*>((string *)local_c0,local_e0,local_d8 + (long)local_e0);
  local_a0._M_p = (pointer)&local_90;
  std::__cxx11::string::_M_construct<char*>((string *)&local_a0,local_e0,local_d8 + (long)local_e0);
  ExpectResult<int>((Result<int> *)&local_80._M_first,false,(bilingual_str *)local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_p != &local_90) {
    operator_delete(local_a0._M_p,
                    CONCAT71(local_90._M_allocated_capacity._1_7_,local_90._M_local_buf[0]) + 1);
  }
  if ((pointer)local_c0._0_8_ != pcVar1) {
    operator_delete((void *)local_c0._0_8_,CONCAT71(local_c0._17_7_,local_c0[0x10]) + 1);
  }
  if (local_e0 != local_d0) {
    operator_delete(local_e0,local_d0[0] + 1);
  }
  std::__detail::__variant::_Variant_storage<false,_bilingual_str,_int>::~_Variant_storage
            ((_Variant_storage<false,_bilingual_str,_int> *)&local_80._M_first);
  local_80._0_8_ = operator_new(4);
  *(undefined4 *)local_80._0_8_ = 5;
  local_40 = 1;
  local_c0._8_8_ = 0;
  local_c0[0x10] = '\0';
  local_98 = 0;
  local_90._M_local_buf[0] = '\0';
  local_1a0._0_4_ = 5;
  local_c0._0_8_ = pcVar1;
  local_a0._M_p = (pointer)&local_90;
  ExpectSuccess<result_tests::NoCopy,int>
            ((Result<result_tests::NoCopy> *)&local_80._M_first,(bilingual_str *)local_c0,
             (int *)local_1a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_p != &local_90) {
    operator_delete(local_a0._M_p,
                    CONCAT71(local_90._M_allocated_capacity._1_7_,local_90._M_local_buf[0]) + 1);
  }
  if ((pointer)local_c0._0_8_ != pcVar1) {
    operator_delete((void *)local_c0._0_8_,CONCAT71(local_c0._17_7_,local_c0[0x10]) + 1);
  }
  std::__detail::__variant::_Variant_storage<false,_bilingual_str,_result_tests::NoCopy>::
  ~_Variant_storage((_Variant_storage<false,_bilingual_str,_result_tests::NoCopy> *)
                    &local_80._M_first);
  NoCopyFn((Result<result_tests::NoCopy> *)&local_80._M_first,5,false);
  local_100 = local_f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"nocopy 5 error.","");
  local_c0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char*>((string *)local_c0,local_100,local_f8 + (long)local_100)
  ;
  local_a0._M_p = (pointer)&local_90;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a0,local_100,local_f8 + (long)local_100);
  ExpectResult<result_tests::NoCopy>
            ((Result<result_tests::NoCopy> *)&local_80._M_first,false,(bilingual_str *)local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_p != &local_90) {
    operator_delete(local_a0._M_p,
                    CONCAT71(local_90._M_allocated_capacity._1_7_,local_90._M_local_buf[0]) + 1);
  }
  if ((pointer)local_c0._0_8_ != pcVar1) {
    operator_delete((void *)local_c0._0_8_,CONCAT71(local_c0._17_7_,local_c0[0x10]) + 1);
  }
  if (local_100 != local_f0) {
    operator_delete(local_100,local_f0[0] + 1);
  }
  std::__detail::__variant::_Variant_storage<false,_bilingual_str,_result_tests::NoCopy>::
  ~_Variant_storage((_Variant_storage<false,_bilingual_str,_result_tests::NoCopy> *)
                    &local_80._M_first);
  local_160 = local_150;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"S","");
  local_140[0] = local_130;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_140,local_160,local_158 + (long)local_160);
  local_120[0] = local_110;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_120,local_160,local_158 + (long)local_160);
  s.original._M_string_length = in_stack_fffffffffffffdc0;
  s.original._M_dataplus._M_p = (pointer)in_stack_fffffffffffffdb8;
  s.original.field_2._M_allocated_capacity = in_stack_fffffffffffffdc8;
  s.original.field_2._8_8_ = in_stack_fffffffffffffdd0;
  s.translated._M_dataplus._M_p = (pointer)in_stack_fffffffffffffdd8;
  s.translated._M_string_length = in_stack_fffffffffffffde0;
  s.translated.field_2._M_allocated_capacity = in_stack_fffffffffffffde8;
  s.translated.field_2._8_8_ = in_stack_fffffffffffffdf0;
  StrFn((Result<bilingual_str> *)&local_80._M_first,s,SUB81(local_140,0));
  local_c0._8_8_ = 0;
  local_c0[0x10] = '\0';
  local_98 = 0;
  local_90._M_local_buf[0] = '\0';
  local_1c0 = local_1b0;
  local_c0._0_8_ = pcVar1;
  local_a0._M_p = (pointer)&local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"S","");
  local_1a0._0_8_ = local_1a0 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1a0,local_1c0,local_1b8 + (long)local_1c0);
  local_180._M_p = (pointer)&local_170;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_180,local_1c0,local_1b8 + (long)local_1c0);
  ExpectSuccess<bilingual_str,bilingual_str>
            ((Result<bilingual_str> *)&local_80._M_first,(bilingual_str *)local_c0,
             (bilingual_str *)local_1a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_p != &local_170) {
    operator_delete(local_180._M_p,local_170._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_1a0._0_8_ != local_1a0 + 0x10) {
    operator_delete((void *)local_1a0._0_8_,local_1a0._16_8_ + 1);
  }
  if (local_1c0 != local_1b0) {
    operator_delete(local_1c0,local_1b0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_p != &local_90) {
    operator_delete(local_a0._M_p,
                    CONCAT71(local_90._M_allocated_capacity._1_7_,local_90._M_local_buf[0]) + 1);
  }
  if ((undefined1 *)local_c0._0_8_ != local_c0 + 0x10) {
    operator_delete((void *)local_c0._0_8_,CONCAT71(local_c0._17_7_,local_c0[0x10]) + 1);
  }
  std::__detail::__variant::_Variant_storage<false,_bilingual_str,_bilingual_str>::~_Variant_storage
            ((_Variant_storage<false,_bilingual_str,_bilingual_str> *)&local_80._M_first);
  if (local_120[0] != local_110) {
    operator_delete(local_120[0],local_110[0] + 1);
  }
  if (local_140[0] != local_130) {
    operator_delete(local_140[0],local_130[0] + 1);
  }
  if (local_160 != local_150) {
    operator_delete(local_160,local_150[0] + 1);
  }
  puVar3 = &stack0xfffffffffffffdf0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffffde0,"S","");
  local_200[0] = local_1f0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_200,puVar3,puVar3 + in_stack_fffffffffffffde8);
  local_1e0[0] = local_1d0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1e0,puVar3,puVar3 + in_stack_fffffffffffffde8);
  s_00.original._M_string_length = in_stack_fffffffffffffdc0;
  s_00.original._M_dataplus._M_p = (pointer)in_stack_fffffffffffffdb8;
  s_00.original.field_2._M_allocated_capacity = in_stack_fffffffffffffdc8;
  s_00.original.field_2._8_8_ = in_stack_fffffffffffffdd0;
  s_00.translated._M_dataplus._M_p = (pointer)in_stack_fffffffffffffdd8;
  s_00.translated._M_string_length = (size_type)puVar3;
  s_00.translated.field_2._M_allocated_capacity = in_stack_fffffffffffffde8;
  s_00.translated.field_2._8_8_ = in_stack_fffffffffffffdf0;
  StrFn((Result<bilingual_str> *)&local_80._M_first,s_00,false);
  puVar2 = &stack0xfffffffffffffdd0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffdc0,"str S error.","");
  local_c0._0_8_ = local_c0 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_c0,puVar2,puVar2 + in_stack_fffffffffffffdc8);
  local_a0._M_p = (pointer)&local_90;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a0,puVar2,puVar2 + in_stack_fffffffffffffdc8);
  ExpectResult<bilingual_str>
            ((Result<bilingual_str> *)&local_80._M_first,false,(bilingual_str *)local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_p != &local_90) {
    operator_delete(local_a0._M_p,
                    CONCAT71(local_90._M_allocated_capacity._1_7_,local_90._M_local_buf[0]) + 1);
  }
  if ((undefined1 *)local_c0._0_8_ != local_c0 + 0x10) {
    operator_delete((void *)local_c0._0_8_,CONCAT71(local_c0._17_7_,local_c0[0x10]) + 1);
  }
  if (puVar2 != &stack0xfffffffffffffdd0) {
    operator_delete(puVar2,in_stack_fffffffffffffdd0 + 1);
  }
  std::__detail::__variant::_Variant_storage<false,_bilingual_str,_bilingual_str>::~_Variant_storage
            ((_Variant_storage<false,_bilingual_str,_bilingual_str> *)&local_80._M_first);
  if (local_1e0[0] != local_1d0) {
    operator_delete(local_1e0[0],local_1d0[0] + 1);
  }
  if (local_200[0] != local_1f0) {
    operator_delete(local_200[0],local_1f0[0] + 1);
  }
  if (puVar3 != &stack0xfffffffffffffdf0) {
    operator_delete(puVar3,in_stack_fffffffffffffdf0 + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(check_returned)
{
    ExpectSuccess(IntFn(5, true), {}, 5);
    ExpectFail(IntFn(5, false), Untranslated("int 5 error."));
    ExpectSuccess(NoCopyFn(5, true), {}, 5);
    ExpectFail(NoCopyFn(5, false), Untranslated("nocopy 5 error."));
    ExpectSuccess(StrFn(Untranslated("S"), true), {}, Untranslated("S"));
    ExpectFail(StrFn(Untranslated("S"), false), Untranslated("str S error."));
}